

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void write_qcoeff(__m128i *qc0,__m128i *qc1,tran_low_t *qcoeff,intptr_t offset)

{
  tran_low_t *ptVar1;
  long lVar2;
  long lVar3;
  longlong lVar4;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  __m128i y1;
  __m128i y0;
  __m128i sign_bits;
  __m128i zero;
  tran_low_t *addr;
  intptr_t offset_local;
  tran_low_t *qcoeff_local;
  __m128i *qc1_local;
  __m128i *qc0_local;
  
  ptVar1 = qcoeff + offset;
  lVar2 = (*qc0)[0];
  lVar3 = (*qc0)[1];
  local_118 = (short)lVar2;
  sStack_116 = (short)((ulong)lVar2 >> 0x10);
  sStack_114 = (short)((ulong)lVar2 >> 0x20);
  sStack_110 = (short)lVar3;
  sStack_10e = (short)((ulong)lVar3 >> 0x10);
  sStack_10c = (short)((ulong)lVar3 >> 0x20);
  lVar4 = (*qc0)[0];
  local_c8 = (undefined2)lVar4;
  uStack_c6 = (undefined2)((ulong)lVar4 >> 0x10);
  uStack_c4 = (undefined2)((ulong)lVar4 >> 0x20);
  uStack_c2 = (undefined2)((ulong)lVar4 >> 0x30);
  lVar4 = (*qc0)[1];
  y1[0]._0_2_ = (undefined2)lVar4;
  y1[0]._2_2_ = (undefined2)((ulong)lVar4 >> 0x10);
  y1[0]._4_2_ = (undefined2)((ulong)lVar4 >> 0x20);
  y1[0]._6_2_ = (undefined2)((ulong)lVar4 >> 0x30);
  *(ulong *)ptVar1 =
       CONCAT26(-(ushort)(sStack_116 < 0),
                CONCAT24(uStack_c6,CONCAT22(-(ushort)(local_118 < 0),local_c8)));
  *(ulong *)(ptVar1 + 2) =
       CONCAT26(-(ushort)(lVar2 < 0),
                CONCAT24(uStack_c2,CONCAT22(-(ushort)(sStack_114 < 0),uStack_c4)));
  *(ulong *)(ptVar1 + 4) =
       CONCAT26(-(ushort)(sStack_10e < 0),
                CONCAT24(y1[0]._2_2_,CONCAT22(-(ushort)(sStack_110 < 0),(undefined2)y1[0])));
  *(ulong *)(ptVar1 + 6) =
       CONCAT26(-(ushort)(lVar3 < 0),
                CONCAT24(y1[0]._6_2_,CONCAT22(-(ushort)(sStack_10c < 0),y1[0]._4_2_)));
  lVar2 = (*qc1)[0];
  lVar3 = (*qc1)[1];
  local_158 = (short)lVar2;
  sStack_156 = (short)((ulong)lVar2 >> 0x10);
  sStack_154 = (short)((ulong)lVar2 >> 0x20);
  sStack_150 = (short)lVar3;
  sStack_14e = (short)((ulong)lVar3 >> 0x10);
  sStack_14c = (short)((ulong)lVar3 >> 0x20);
  lVar4 = (*qc1)[0];
  local_e8 = (undefined2)lVar4;
  uStack_e6 = (undefined2)((ulong)lVar4 >> 0x10);
  uStack_e4 = (undefined2)((ulong)lVar4 >> 0x20);
  uStack_e2 = (undefined2)((ulong)lVar4 >> 0x30);
  lVar4 = (*qc1)[1];
  uStack_a0 = (undefined2)lVar4;
  uStack_9e = (undefined2)((ulong)lVar4 >> 0x10);
  uStack_9c = (undefined2)((ulong)lVar4 >> 0x20);
  uStack_9a = (undefined2)((ulong)lVar4 >> 0x30);
  *(ulong *)(ptVar1 + 8) =
       CONCAT26(-(ushort)(sStack_156 < 0),
                CONCAT24(uStack_e6,CONCAT22(-(ushort)(local_158 < 0),local_e8)));
  *(ulong *)(ptVar1 + 10) =
       CONCAT26(-(ushort)(lVar2 < 0),
                CONCAT24(uStack_e2,CONCAT22(-(ushort)(sStack_154 < 0),uStack_e4)));
  *(ulong *)(ptVar1 + 0xc) =
       CONCAT26(-(ushort)(sStack_14e < 0),
                CONCAT24(uStack_9e,CONCAT22(-(ushort)(sStack_150 < 0),uStack_a0)));
  *(ulong *)(ptVar1 + 0xe) =
       CONCAT26(-(ushort)(lVar3 < 0),
                CONCAT24(uStack_9a,CONCAT22(-(ushort)(sStack_14c < 0),uStack_9c)));
  return;
}

Assistant:

static inline void write_qcoeff(const __m128i *qc0, const __m128i *qc1,
                                tran_low_t *qcoeff, intptr_t offset) {
  tran_low_t *addr = qcoeff + offset;
  if (sizeof(tran_low_t) == 4) {
    const __m128i zero = _mm_setzero_si128();
    __m128i sign_bits = _mm_cmplt_epi16(*qc0, zero);
    __m128i y0 = _mm_unpacklo_epi16(*qc0, sign_bits);
    __m128i y1 = _mm_unpackhi_epi16(*qc0, sign_bits);
    _mm_store_si128((__m128i *)addr, y0);
    _mm_store_si128((__m128i *)addr + 1, y1);

    sign_bits = _mm_cmplt_epi16(*qc1, zero);
    y0 = _mm_unpacklo_epi16(*qc1, sign_bits);
    y1 = _mm_unpackhi_epi16(*qc1, sign_bits);
    _mm_store_si128((__m128i *)addr + 2, y0);
    _mm_store_si128((__m128i *)addr + 3, y1);
  } else {
    _mm_store_si128((__m128i *)addr, *qc0);
    _mm_store_si128((__m128i *)addr + 1, *qc1);
  }
}